

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

cmServerProtocol *
cmServer::FindMatchingProtocol
          (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *protocols,int major,
          int minor)

{
  cmServerProtocol *pcVar1;
  cmServerProtocol *pcVar2;
  bool bVar3;
  int iVar4;
  reference ppcVar5;
  int extraout_var;
  int extraout_var_00;
  vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *local_68;
  pair<int,_int> version;
  cmServerProtocol *protocol;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *__range1;
  cmServerProtocol *bestMatch;
  int minor_local;
  int major_local;
  vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *protocols_local;
  
  __range1 = (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *)0x0;
  __end1 = std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::begin(protocols);
  protocol = (cmServerProtocol *)
             std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::end(protocols);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmServerProtocol_*const_*,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
                                *)&protocol);
    if (!bVar3) {
      if (minor < 0) {
        local_68 = __range1;
      }
      else {
        local_68 = (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *)0x0;
      }
      return (cmServerProtocol *)local_68;
    }
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmServerProtocol_*const_*,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
              ::operator*(&__end1);
    pcVar1 = *ppcVar5;
    iVar4 = (*pcVar1->_vptr_cmServerProtocol[2])();
    pcVar2 = (cmServerProtocol *)__range1;
    if (major == iVar4) {
      if (minor == extraout_var) {
        return pcVar1;
      }
      bVar3 = true;
      if (__range1 != (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *)0x0) {
        (*(code *)(__range1->
                  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[2])();
        bVar3 = extraout_var_00 < extraout_var;
      }
      pcVar2 = pcVar1;
      if (!bVar3) {
        pcVar2 = (cmServerProtocol *)__range1;
      }
    }
    __range1 = (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *)pcVar2;
    __gnu_cxx::
    __normal_iterator<cmServerProtocol_*const_*,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

cmServerProtocol* cmServer::FindMatchingProtocol(
  const std::vector<cmServerProtocol*>& protocols, int major, int minor)
{
  cmServerProtocol* bestMatch = nullptr;
  for (auto protocol : protocols) {
    auto version = protocol->ProtocolVersion();
    if (major != version.first) {
      continue;
    }
    if (minor == version.second) {
      return protocol;
    }
    if (!bestMatch || bestMatch->ProtocolVersion().second < version.second) {
      bestMatch = protocol;
    }
  }
  return minor < 0 ? bestMatch : nullptr;
}